

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O1

psa_status_t
psa_its_get(psa_storage_uid_t uid,uint32_t data_offset,uint32_t data_length,void *p_data,
           size_t *p_data_length)

{
  FILE *__stream;
  psa_status_t pVar1;
  int iVar2;
  size_t sVar3;
  FILE *stream;
  psa_storage_info_t info;
  FILE *local_40;
  psa_storage_info_t local_38;
  
  local_40 = (FILE *)0x0;
  pVar1 = psa_its_read_file(uid,&local_38,(FILE **)&local_40);
  __stream = local_40;
  if (pVar1 == 0) {
    pVar1 = -0x87;
    if ((!CARRY4(data_length,data_offset)) && (data_length + data_offset <= local_38.size)) {
      iVar2 = fseek(local_40,(ulong)data_offset,1);
      pVar1 = -0x92;
      if (iVar2 == 0) {
        sVar3 = fread(p_data,1,(ulong)data_length,__stream);
        if ((sVar3 == data_length) && (pVar1 = 0, p_data_length != (size_t *)0x0)) {
          *p_data_length = sVar3;
        }
      }
    }
  }
  if (local_40 != (FILE *)0x0) {
    fclose(local_40);
  }
  return pVar1;
}

Assistant:

psa_status_t psa_its_get( psa_storage_uid_t uid,
                          uint32_t data_offset,
                          uint32_t data_length,
                          void *p_data,
                          size_t *p_data_length )
{
    psa_status_t status;
    FILE *stream = NULL;
    size_t n;
    struct psa_storage_info_t info;

    status = psa_its_read_file( uid, &info, &stream );
    if( status != PSA_SUCCESS )
        goto exit;
    status = PSA_ERROR_INVALID_ARGUMENT;
    if( data_offset + data_length < data_offset )
        goto exit;
#if SIZE_MAX < 0xffffffff
    if( data_offset + data_length > SIZE_MAX )
        goto exit;
#endif
    if( data_offset + data_length > info.size )
        goto exit;

    status = PSA_ERROR_STORAGE_FAILURE;
#if LONG_MAX < 0xffffffff
    while( data_offset > LONG_MAX )
    {
        if( fseek( stream, LONG_MAX, SEEK_CUR ) != 0 )
            goto exit;
        data_offset -= LONG_MAX;
    }
#endif
    if( fseek( stream, data_offset, SEEK_CUR ) != 0 )
        goto exit;
    n = fread( p_data, 1, data_length, stream );
    if( n != data_length )
        goto exit;
    status = PSA_SUCCESS;
    if( p_data_length != NULL )
        *p_data_length = n;

exit:
    if( stream != NULL )
        fclose( stream );
    return( status );
}